

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O2

path * __thiscall filesystem::path::operator=(path *this,path *path)

{
  this->m_type = path->m_type;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->m_path,&path->m_path);
  this->m_absolute = path->m_absolute;
  this->m_smb = path->m_smb;
  return this;
}

Assistant:

path &operator=(const path &path) {
        m_type = path.m_type;
        m_path = path.m_path;
        m_absolute = path.m_absolute;
        m_smb = path.m_smb;
        return *this;
    }